

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O1

double tu_product(int i,int j,double x)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((j | i) < 0) {
    dVar5 = 0.0;
  }
  else {
    if (i == 0) {
      dVar5 = u_polynomial_value(j,x);
      return dVar5;
    }
    iVar1 = i - j;
    iVar2 = -iVar1;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    dVar5 = 0.0;
    for (; iVar2 <= j + i; iVar2 = iVar2 + 2) {
      dVar3 = u_polynomial_value(iVar2,x);
      dVar5 = dVar5 + dVar3;
    }
    iVar1 = (i + -2) - j;
    iVar2 = -iVar1;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    dVar3 = 0.0;
    for (; iVar2 <= j + i + -2; iVar2 = iVar2 + 2) {
      dVar4 = u_polynomial_value(iVar2,x);
      dVar3 = dVar3 + dVar4;
    }
    dVar5 = (dVar5 - dVar3) * 0.5;
  }
  return dVar5;
}

Assistant:

double tu_product ( int i, int j, double x )

//****************************************************************************80
//
//  Purpose:
//
//    TU_PRODUCT: evaluate T(i,x)*U(j,x)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 July 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, J, the indices.
//
//    Input, double X, the argument.
//
//    Output, double TU_PRODUCT, the value.
//
{
  double value;

  if ( i < 0 )
  {
    value = 0.0;
  }
  else if ( j < 0 )
  {
    value = 0.0;
  }
  else if ( i == 0 )
  {
    value = u_polynomial_value ( j, x );
  }
  else
  {
    value = 0.5 * ( uu_product ( i, j, x ) - uu_product ( i - 2, j, x ) );
  }

  return value;
}